

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlParser.cpp
# Opt level: O1

void __thiscall KDReports::Test::vspaceInHeader(Test *this)

{
  QStringView QVar1;
  QStringView QVar2;
  QStringView QVar3;
  QStringView QVar4;
  bool bVar5;
  char cVar6;
  byte bVar7;
  int iVar8;
  longlong __tmp;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  ErrorDetails details;
  QArrayDataPointer<char16_t> local_b8;
  QArrayDataPointer<char16_t> local_a0;
  QFile file;
  Report report;
  QArrayDataPointer<char16_t> local_58;
  char *local_40;
  QStringView local_38;
  
  local_b8.d = (Data *)0x111011;
  QByteArrayView::QByteArrayView<const_char_*,_true>((QByteArrayView *)&local_a0,(char **)&local_b8)
  ;
  QVar9.m_data = (storage_type *)local_a0.d;
  QVar9.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar9);
  _report = local_58.d;
  local_58.d = (Data *)0x0;
  local_58.ptr = (char16_t *)0x0;
  local_58.size = 0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  QFile::QFile(&file,(QString *)&report);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&report);
  bVar5 = (bool)QFile::open(&file,1);
  cVar6 = QTest::qVerify(bVar5,"file.open(QIODevice::ReadOnly)","",
                         "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                         ,0xe4);
  if (cVar6 != '\0') {
    KDReports::Report::Report(&report,(QObject *)0x0);
    KDReports::ErrorDetails::ErrorDetails(&details);
    bVar7 = KDReports::Report::loadFromXML((QIODevice *)&report,(ErrorDetails *)&file);
    cVar6 = QTest::qVerify((bool)(bVar7 ^ 1),"!report.loadFromXML(&file, &details)","",
                           "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                           ,0xe7);
    if (cVar6 != '\0') {
      iVar8 = KDReports::ErrorDetails::line();
      cVar6 = QTest::qCompare(iVar8,-1,"details.line()","-1",
                              "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                              ,0xe8);
      if (cVar6 != '\0') {
        iVar8 = KDReports::ErrorDetails::column();
        cVar6 = QTest::qCompare(iVar8,-1,"details.column()","-1",
                                "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                ,0xe9);
        if (cVar6 != '\0') {
          KDReports::ErrorDetails::driverMessage();
          local_40 = "<vspace> not allowed in headers, footers, or table cells";
          QByteArrayView::QByteArrayView<const_char_*,_true>((QByteArrayView *)&local_38,&local_40);
          QVar10.m_data = (storage_type *)local_38.m_size;
          QVar10.m_size = (qsizetype)&local_58;
          QString::fromUtf8(QVar10);
          local_b8.d = local_58.d;
          local_b8.ptr = local_58.ptr;
          local_58.d = (Data *)0x0;
          local_58.ptr = (char16_t *)0x0;
          local_b8.size = local_58.size;
          local_58.size = 0;
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
          QStringView::QStringView<QChar,_true>
                    ((QStringView *)&local_58,(QChar *)local_a0.ptr,local_a0.size);
          QStringView::QStringView<QChar,_true>(&local_38,(QChar *)local_b8.ptr,local_b8.size);
          QVar1.m_data = local_58.ptr;
          QVar1.m_size = (qsizetype)local_58.d;
          QVar3.m_data = local_38.m_data;
          QVar3.m_size = local_38.m_size;
          cVar6 = QTest::qCompare(QVar1,QVar3,"details.driverMessage()",
                                  "QString(\"<vspace> not allowed in headers, footers, or table cells\")"
                                  ,
                                  "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                  ,0xea);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
          if (cVar6 != '\0') {
            KDReports::ErrorDetails::message();
            local_40 = "<vspace> not allowed in headers, footers, or table cells";
            QByteArrayView::QByteArrayView<const_char_*,_true>
                      ((QByteArrayView *)&local_38,&local_40);
            QVar11.m_data = (storage_type *)local_38.m_size;
            QVar11.m_size = (qsizetype)&local_58;
            QString::fromUtf8(QVar11);
            local_b8.d = local_58.d;
            local_b8.ptr = local_58.ptr;
            local_58.d = (Data *)0x0;
            local_58.ptr = (char16_t *)0x0;
            local_b8.size = local_58.size;
            local_58.size = 0;
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
            QStringView::QStringView<QChar,_true>
                      ((QStringView *)&local_58,(QChar *)local_a0.ptr,local_a0.size);
            QStringView::QStringView<QChar,_true>(&local_38,(QChar *)local_b8.ptr,local_b8.size);
            QVar2.m_data = local_58.ptr;
            QVar2.m_size = (qsizetype)local_58.d;
            QVar4.m_data = local_38.m_data;
            QVar4.m_size = local_38.m_size;
            QTest::qCompare(QVar2,QVar4,"details.message()",
                            "QString(\"<vspace> not allowed in headers, footers, or table cells\")",
                            "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                            ,0xeb);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
          }
        }
      }
    }
    KDReports::ErrorDetails::~ErrorDetails(&details);
    KDReports::Report::~Report(&report);
  }
  QFile::~QFile(&file);
  return;
}

Assistant:

void vspaceInHeader()
    {
        QFile file(":/vspaceInHeader.xml");
        QVERIFY(file.open(QIODevice::ReadOnly));
        Report report;
        KDReports::ErrorDetails details;
        QVERIFY(!report.loadFromXML(&file, &details));
        QCOMPARE(details.line(), -1);
        QCOMPARE(details.column(), -1);
        QCOMPARE(details.driverMessage(), QString("<vspace> not allowed in headers, footers, or table cells"));
        QCOMPARE(details.message(), QString("<vspace> not allowed in headers, footers, or table cells"));
    }